

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

int __thiscall gl4cts::ShaderSubroutineTests::init(ShaderSubroutineTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  APITest1 *this_00;
  APITest2 *this_01;
  FunctionalTest1_2 *this_02;
  FunctionalTest3_4 *this_03;
  FunctionalTest5 *this_04;
  TestNode *node;
  FunctionalTest7_8 *this_05;
  FunctionalTest9 *this_06;
  FunctionalTest10 *this_07;
  FunctionalTest11 *this_08;
  FunctionalTest12 *this_09;
  FunctionalTest13 *this_10;
  FunctionalTest14_15 *this_11;
  FunctionalTest16 *this_12;
  FunctionalTest17 *this_13;
  FunctionalTest18_19 *this_14;
  FunctionalTest20_21 *this_15;
  NegativeTest1 *this_16;
  NegativeTest2 *this_17;
  NegativeTest3 *this_18;
  NegativeTest4 *this_19;
  NegativeTest5 *this_20;
  NegativeTest6 *this_21;
  NegativeTest7 *this_22;
  NegativeTest8 *this_23;
  NegativeTest9 *this_24;
  NegativeTest10 *this_25;
  NegativeTest11 *this_26;
  NegativeTest12 *this_27;
  ShaderSubroutineTests *this_local;
  
  this_00 = (APITest1 *)operator_new(0x80);
  ShaderSubroutine::APITest1::APITest1(this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (APITest2 *)operator_new(0xa8);
  ShaderSubroutine::APITest2::APITest2(this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (FunctionalTest1_2 *)operator_new(0xb8);
  ShaderSubroutine::FunctionalTest1_2::FunctionalTest1_2
            (this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (FunctionalTest3_4 *)operator_new(0x90);
  ShaderSubroutine::FunctionalTest3_4::FunctionalTest3_4
            (this_03,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (FunctionalTest5 *)operator_new(0xb8);
  ShaderSubroutine::FunctionalTest5::FunctionalTest5(this_04,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  node = (TestNode *)operator_new(0x78);
  ShaderSubroutine::FunctionalTest6::FunctionalTest6
            ((FunctionalTest6 *)node,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,node);
  this_05 = (FunctionalTest7_8 *)operator_new(0xa0);
  ShaderSubroutine::FunctionalTest7_8::FunctionalTest7_8
            (this_05,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  this_06 = (FunctionalTest9 *)operator_new(0x90);
  ShaderSubroutine::FunctionalTest9::FunctionalTest9(this_06,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
  this_07 = (FunctionalTest10 *)operator_new(0xc0);
  ShaderSubroutine::FunctionalTest10::FunctionalTest10
            (this_07,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
  this_08 = (FunctionalTest11 *)operator_new(200);
  ShaderSubroutine::FunctionalTest11::FunctionalTest11
            (this_08,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
  this_09 = (FunctionalTest12 *)operator_new(0x80);
  ShaderSubroutine::FunctionalTest12::FunctionalTest12
            (this_09,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_09);
  this_10 = (FunctionalTest13 *)operator_new(200);
  ShaderSubroutine::FunctionalTest13::FunctionalTest13
            (this_10,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_10);
  this_11 = (FunctionalTest14_15 *)operator_new(0xb0);
  ShaderSubroutine::FunctionalTest14_15::FunctionalTest14_15
            (this_11,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_11);
  this_12 = (FunctionalTest16 *)operator_new(0x4f0);
  ShaderSubroutine::FunctionalTest16::FunctionalTest16
            (this_12,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_12);
  this_13 = (FunctionalTest17 *)operator_new(0xb8);
  ShaderSubroutine::FunctionalTest17::FunctionalTest17
            (this_13,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_13);
  this_14 = (FunctionalTest18_19 *)operator_new(0xb0);
  ShaderSubroutine::FunctionalTest18_19::FunctionalTest18_19
            (this_14,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_14);
  this_15 = (FunctionalTest20_21 *)operator_new(0xf0);
  ShaderSubroutine::FunctionalTest20_21::FunctionalTest20_21
            (this_15,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_15);
  this_16 = (NegativeTest1 *)operator_new(0xa8);
  ShaderSubroutine::NegativeTest1::NegativeTest1(this_16,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_16);
  this_17 = (NegativeTest2 *)operator_new(0x98);
  ShaderSubroutine::NegativeTest2::NegativeTest2(this_17,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_17);
  this_18 = (NegativeTest3 *)operator_new(0x80);
  ShaderSubroutine::NegativeTest3::NegativeTest3(this_18,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_18);
  this_19 = (NegativeTest4 *)operator_new(0x80);
  ShaderSubroutine::NegativeTest4::NegativeTest4(this_19,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_19);
  this_20 = (NegativeTest5 *)operator_new(0x98);
  ShaderSubroutine::NegativeTest5::NegativeTest5(this_20,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_20);
  this_21 = (NegativeTest6 *)operator_new(0x98);
  ShaderSubroutine::NegativeTest6::NegativeTest6(this_21,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_21);
  this_22 = (NegativeTest7 *)operator_new(0x80);
  ShaderSubroutine::NegativeTest7::NegativeTest7(this_22,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_22);
  this_23 = (NegativeTest8 *)operator_new(0x98);
  ShaderSubroutine::NegativeTest8::NegativeTest8(this_23,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_23);
  this_24 = (NegativeTest9 *)operator_new(0x88);
  ShaderSubroutine::NegativeTest9::NegativeTest9(this_24,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_24);
  this_25 = (NegativeTest10 *)operator_new(0xb0);
  ShaderSubroutine::NegativeTest10::NegativeTest10(this_25,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_25);
  this_26 = (NegativeTest11 *)operator_new(0x88);
  ShaderSubroutine::NegativeTest11::NegativeTest11(this_26,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_26);
  this_27 = (NegativeTest12 *)operator_new(0x88);
  ShaderSubroutine::NegativeTest12::NegativeTest12(this_27,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_27);
  return extraout_EAX;
}

Assistant:

void ShaderSubroutineTests::init(void)
{
	addChild(new ShaderSubroutine::APITest1(m_context));
	addChild(new ShaderSubroutine::APITest2(m_context));
	addChild(new ShaderSubroutine::FunctionalTest1_2(m_context));
	addChild(new ShaderSubroutine::FunctionalTest3_4(m_context));
	addChild(new ShaderSubroutine::FunctionalTest5(m_context));
	addChild(new ShaderSubroutine::FunctionalTest6(m_context));
	addChild(new ShaderSubroutine::FunctionalTest7_8(m_context));
	addChild(new ShaderSubroutine::FunctionalTest9(m_context));
	addChild(new ShaderSubroutine::FunctionalTest10(m_context));
	addChild(new ShaderSubroutine::FunctionalTest11(m_context));
	addChild(new ShaderSubroutine::FunctionalTest12(m_context));
	addChild(new ShaderSubroutine::FunctionalTest13(m_context));
	addChild(new ShaderSubroutine::FunctionalTest14_15(m_context));
	addChild(new ShaderSubroutine::FunctionalTest16(m_context));
	addChild(new ShaderSubroutine::FunctionalTest17(m_context));
	addChild(new ShaderSubroutine::FunctionalTest18_19(m_context));
	addChild(new ShaderSubroutine::FunctionalTest20_21(m_context));
	addChild(new ShaderSubroutine::NegativeTest1(m_context));
	addChild(new ShaderSubroutine::NegativeTest2(m_context));
	addChild(new ShaderSubroutine::NegativeTest3(m_context));
	addChild(new ShaderSubroutine::NegativeTest4(m_context));
	addChild(new ShaderSubroutine::NegativeTest5(m_context));
	addChild(new ShaderSubroutine::NegativeTest6(m_context));
	addChild(new ShaderSubroutine::NegativeTest7(m_context));
	addChild(new ShaderSubroutine::NegativeTest8(m_context));
	addChild(new ShaderSubroutine::NegativeTest9(m_context));
	addChild(new ShaderSubroutine::NegativeTest10(m_context));
	addChild(new ShaderSubroutine::NegativeTest11(m_context));
	addChild(new ShaderSubroutine::NegativeTest12(m_context));
}